

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O2

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  undefined8 *puVar7;
  long lVar8;
  int iVar9;
  __m128 *pafVar10;
  float fVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  __m128 afVar16;
  binary_op_pow op;
  __m128 _a0;
  __m128 _p_1;
  __m256 _a0_avx;
  binary_op_pow local_141;
  undefined8 local_140;
  void *local_138;
  Mat *local_130;
  ulong local_128;
  Mat *local_120;
  Mat *local_118;
  size_t local_110;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  void *local_f0;
  ulong local_e8;
  __m128 local_e0;
  float afStack_d0 [2];
  float afStack_c8 [6];
  float local_b0 [2];
  float afStack_a8 [2];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  uVar1 = b->c;
  iVar9 = b->h * b->w * b->d * b->elempack;
  local_120 = a;
  local_118 = b;
  Mat::create_like(c,b,opt->blob_allocator);
  local_140 = 0xffffffffffffff9c;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    local_140 = 0;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    local_128 = (ulong)uVar1;
    local_e8 = 0;
    local_130 = c;
    while (local_e8 != local_128) {
      local_a0 = *local_120->data;
      local_f0 = local_118->data;
      local_100 = local_118->elemsize;
      local_f8 = local_118->cstep;
      pafVar10 = (__m128 *)(local_f8 * local_e8 * local_100 + (long)local_f0);
      local_138 = c->data;
      local_110 = c->elemsize;
      local_108 = c->cstep;
      puVar7 = (undefined8 *)(local_108 * local_e8 * local_110 + (long)local_138);
      lVar8 = 0;
      fStack_9c = local_a0;
      fStack_98 = local_a0;
      fStack_94 = local_a0;
      fStack_90 = local_a0;
      fStack_8c = local_a0;
      fStack_88 = local_a0;
      fStack_84 = local_a0;
      local_80 = local_a0;
      fStack_7c = local_a0;
      fStack_78 = local_a0;
      fStack_74 = local_a0;
      fStack_70 = local_a0;
      fStack_6c = local_a0;
      fStack_68 = local_a0;
      fStack_64 = local_a0;
      for (iVar6 = 0; iVar6 + 7 < iVar9; iVar6 = iVar6 + 8) {
        uVar13 = *(undefined8 *)*pafVar10;
        uVar12 = *(undefined8 *)(*pafVar10 + 2);
        local_e0 = *pafVar10;
        uVar14 = *(undefined8 *)pafVar10[1];
        uVar15 = *(undefined8 *)(pafVar10[1] + 2);
        afStack_d0 = (float  [2])uVar14;
        afStack_c8._0_8_ = uVar15;
        BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                  (&local_141,(__m256 *)&local_80,(__m256 *)local_e0);
        *puVar7 = uVar13;
        puVar7[1] = uVar12;
        puVar7[2] = uVar14;
        puVar7[3] = uVar15;
        pafVar10 = pafVar10 + 2;
        puVar7 = puVar7 + 4;
        lVar8 = lVar8 + 8;
      }
      auVar2._4_4_ = fStack_9c;
      auVar2._0_4_ = local_a0;
      auVar2._8_4_ = fStack_98;
      auVar2._12_4_ = fStack_94;
      local_e0 = (__m128)vpermilps_avx(auVar2,0);
      for (; uVar4 = local_e8, pvVar3 = local_f0, c = local_130, iVar6 + 3 < iVar9;
          iVar6 = iVar6 + 4) {
        local_b0 = *(float (*) [2])*pafVar10;
        uVar13 = *(undefined8 *)(*pafVar10 + 2);
        afStack_a8 = (float  [2])uVar13;
        afVar16 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                            (&local_141,&local_e0,(__m128 *)local_b0);
        *puVar7 = afVar16._0_8_;
        puVar7[1] = uVar13;
        pafVar10 = pafVar10 + 1;
        puVar7 = puVar7 + 2;
        lVar8 = lVar8 + 4;
      }
      lVar5 = local_f8 * local_100 * local_e8;
      local_138 = (void *)((long)local_138 + local_108 * local_110 * local_e8);
      for (; (int)lVar8 < iVar9; lVar8 = lVar8 + 1) {
        fVar11 = powf(local_a0,*(float *)((long)pvVar3 + lVar8 * 4 + lVar5));
        *(float *)((long)local_138 + lVar8 * 4) = fVar11;
      }
      local_e8 = uVar4 + 1;
    }
  }
  return (int)local_140;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}